

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O1

int resolve_len_ran_interval(ly_ctx *ctx,char *str_restr,lys_type *type,len_ran_intv **ret)

{
  char cVar1;
  ushort uVar2;
  ushort *puVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int64_t num1;
  int64_t num1_00;
  len_ran_intv *plVar9;
  bool bVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  int iVar14;
  uint *puVar15;
  lys_type_bit *plVar16;
  len_ran_intv *plVar17;
  ushort **ppuVar18;
  ulonglong uVar19;
  uint *puVar20;
  char *pcVar21;
  len_ran_intv *plVar22;
  uint *puVar23;
  uint *puVar24;
  byte bVar25;
  char *pcVar26;
  len_ran_intv *plVar27;
  uint *puVar28;
  uint *puVar29;
  uint *puVar30;
  len_ran_intv *plVar31;
  len_ran_intv *local_78;
  len_ran_intv *local_70;
  uint local_64;
  char *local_60;
  uint *local_58;
  undefined8 local_50;
  undefined8 local_48;
  uint *local_40;
  uint local_34;
  
  local_78 = (len_ran_intv *)0x0;
  iVar14 = -1;
  uVar13 = type->base - LY_TYPE_BINARY;
  if (0x12 < uVar13) {
    return -1;
  }
  puVar23 = &switchD_0011524f::switchdataD_001a262c;
  puVar15 = (uint *)((long)&switchD_0011524f::switchdataD_001a262c +
                    (long)(int)(&switchD_0011524f::switchdataD_001a262c)[uVar13]);
  switch(type->base) {
  case LY_TYPE_BINARY:
  case LY_TYPE_STRING:
  case LY_TYPE_UINT64:
    if (str_restr == (char *)0x0) {
      plVar16 = (type->info).bits.bit;
      local_58 = (uint *)0xffffffffffffffff;
      break;
    }
    local_58 = (uint *)0xffffffffffffffff;
LAB_0011536d:
    local_50 = CONCAT71((int7)((ulong)puVar15 >> 8),1);
    goto LAB_0011537b;
  default:
    goto switchD_0011524f_caseD_2;
  case LY_TYPE_DEC64:
    bVar25 = (type->info).dec64.dig;
    if (str_restr == (char *)0x0) {
      plVar16 = (type->info).bits.bit;
      local_34 = 2;
      local_40 = (uint *)0x0;
      local_50 = 0;
      if (plVar16 == (lys_type_bit *)0x0) {
        str_restr = (char *)0x0;
        goto LAB_00115315;
      }
      local_48 = 0;
      puVar23 = (uint *)0x0;
      local_58 = (uint *)0x0;
      goto LAB_00115505;
    }
LAB_00115315:
    local_34 = 2;
    local_40 = (uint *)0x0;
    local_48 = 0;
    local_50 = 0;
    puVar23 = (uint *)0x0;
    local_58 = (uint *)0x0;
    goto LAB_0011550b;
  case LY_TYPE_INT8:
    if (str_restr != (char *)0x0) {
      puVar23 = (uint *)0x7f;
      local_40 = (uint *)0xffffffffffffff80;
      goto LAB_001153a9;
    }
    plVar16 = (type->info).bits.bit;
    puVar23 = (uint *)0x7f;
    local_40 = (uint *)0xffffffffffffff80;
LAB_001154dd:
    local_34 = 1;
    local_48 = 0x1a2601;
    local_58 = (uint *)0x0;
    local_50 = 0;
    if (plVar16 != (lys_type_bit *)0x0) goto LAB_00115503;
    str_restr = (char *)0x0;
    goto LAB_001153c6;
  case LY_TYPE_UINT8:
    if (str_restr != (char *)0x0) {
      puVar15 = (uint *)0xff;
      local_58 = puVar15;
      goto LAB_0011536d;
    }
    plVar16 = (type->info).bits.bit;
    puVar23 = (uint *)0xff;
    local_58 = puVar23;
    break;
  case LY_TYPE_INT16:
    if (str_restr == (char *)0x0) {
      plVar16 = (type->info).bits.bit;
      puVar23 = (uint *)0x7fff;
      local_40 = (uint *)0xffffffffffff8000;
      goto LAB_001154dd;
    }
    puVar23 = (uint *)0x7fff;
    local_40 = (uint *)0xffffffffffff8000;
    goto LAB_001153a9;
  case LY_TYPE_UINT16:
    if (str_restr != (char *)0x0) {
      puVar15 = (uint *)0xffff;
      local_58 = puVar15;
      goto LAB_0011536d;
    }
    plVar16 = (type->info).bits.bit;
    puVar23 = (uint *)0xffff;
    local_58 = puVar23;
    break;
  case LY_TYPE_INT32:
    if (str_restr == (char *)0x0) {
      plVar16 = (type->info).bits.bit;
      puVar23 = (uint *)0x7fffffff;
      local_40 = (uint *)0xffffffff80000000;
      goto LAB_001154dd;
    }
    puVar23 = (uint *)0x7fffffff;
    local_40 = (uint *)0xffffffff80000000;
LAB_001153a9:
    local_48 = CONCAT71((int7)((ulong)puVar15 >> 8),1);
LAB_001153be:
    local_34 = 1;
    local_50 = 0;
    local_58 = (uint *)0x0;
    goto LAB_001153c6;
  case LY_TYPE_UINT32:
    puVar15 = (uint *)0xffffffff;
    local_58 = (uint *)0xffffffff;
    if (str_restr != (char *)0x0) goto LAB_0011536d;
    plVar16 = (type->info).bits.bit;
    break;
  case LY_TYPE_INT64:
    if (str_restr == (char *)0x0) {
      plVar16 = (type->info).bits.bit;
      puVar23 = (uint *)0x7fffffffffffffff;
      local_40 = (uint *)0x8000000000000000;
      local_58 = (uint *)0x0;
      local_34 = 1;
      local_48 = 0x8000000000000001;
      local_50 = 0;
      if (plVar16 != (lys_type_bit *)0x0) {
        bVar25 = 0;
        goto LAB_00115505;
      }
      str_restr = (char *)0x0;
      bVar25 = 0;
      goto LAB_0011550b;
    }
    puVar23 = (uint *)0x7fffffffffffffff;
    local_40 = (uint *)0x8000000000000000;
    local_48 = 0x8000000000000001;
    goto LAB_001153be;
  }
  local_48 = 0;
  local_50 = CONCAT71((int7)((ulong)puVar23 >> 8),1);
  if (plVar16 == (lys_type_bit *)0x0) {
    str_restr = (char *)0x0;
LAB_0011537b:
    local_48 = 0;
    local_34 = 0;
    local_40 = (uint *)0x0;
    puVar23 = (uint *)0x0;
LAB_001153c6:
    bVar25 = 0;
  }
  else {
    local_34 = 0;
    local_40 = (uint *)0x0;
    puVar23 = (uint *)0x0;
LAB_00115503:
    bVar25 = 0;
LAB_00115505:
    str_restr = plVar16->name;
  }
LAB_0011550b:
  if (type->der != (lys_tpdf *)0x0) {
    iVar14 = resolve_len_ran_interval(ctx,(char *)0x0,&type->der->type,&local_78);
    if (iVar14 != 0) {
      return -1;
    }
    if ((local_78 != (len_ran_intv *)0x0) && (local_34 != local_78->kind)) {
      __assert_fail("!intv || (intv->kind == kind)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0xbdf,
                    "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                   );
    }
  }
  plVar22 = local_78;
  if (str_restr != (char *)0x0) {
    puVar15 = puVar23;
    if (local_78 == (len_ran_intv *)0x0) {
      puVar29 = (uint *)0x8000000000000000;
      puVar24 = (uint *)0x0;
      puVar28 = (uint *)0x7fffffffffffffff;
      puVar30 = local_58;
    }
    else {
      puVar30 = (uint *)(local_78->value).uval.min;
      puVar20 = local_40;
      if ((char)local_48 != '\0') {
        puVar20 = puVar30;
      }
      puVar28 = (uint *)0x7fffffffffffffff;
      puVar29 = puVar30;
      if ((char)local_48 != '\0') {
        puVar29 = (uint *)0x8000000000000000;
      }
      puVar24 = (uint *)0x0;
      if ((char)local_50 != '\0') {
        puVar20 = local_40;
        puVar29 = (uint *)0x8000000000000000;
        puVar24 = puVar30;
      }
      do {
        local_40 = puVar20;
        plVar31 = plVar22;
        plVar22 = plVar31->next;
        puVar20 = local_40;
      } while (plVar22 != (len_ran_intv *)0x0);
      puVar20 = (uint *)(plVar31->value).sval.max;
      puVar30 = puVar20;
      if (((char)local_50 == '\0') &&
         (puVar15 = puVar20, puVar30 = local_58, (char)local_48 == '\0')) {
        puVar28 = puVar20;
        puVar15 = puVar23;
      }
    }
    local_58 = puVar30;
    puVar30 = puVar29;
    puVar23 = puVar28;
    if ((char)local_48 != '\0') {
      puVar30 = local_40;
      puVar23 = puVar15;
    }
    if ((char)local_50 != '\0') {
      puVar30 = puVar24;
      puVar23 = local_58;
    }
    plVar22 = (len_ran_intv *)0x0;
    local_64 = (uint)bVar25;
    plVar31 = (len_ran_intv *)0x0;
    do {
      if (plVar31 == (len_ran_intv *)0x0) {
        if (plVar22 != (len_ran_intv *)0x0) {
          __assert_fail("!local_intv",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                        ,0xc06,
                        "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                       );
        }
        plVar17 = (len_ran_intv *)malloc(0x28);
        plVar22 = plVar17;
      }
      else {
        plVar17 = (len_ran_intv *)malloc(0x28);
        plVar31->next = plVar17;
      }
      if (plVar17 == (len_ran_intv *)0x0) {
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","resolve_len_ran_interval");
        plVar31 = local_78;
        goto joined_r0x00115ad5;
      }
      plVar17->kind = (uint8_t)local_34;
      plVar17->type = type;
      plVar17->next = (len_ran_intv *)0x0;
      local_70 = plVar31;
      ppuVar18 = __ctype_b_loc();
      pcVar21 = str_restr;
      do {
        pcVar26 = pcVar21;
        cVar1 = *pcVar26;
        pcVar21 = pcVar26 + 1;
      } while (((*ppuVar18)[cVar1] >> 0xd & 1) != 0);
      local_60 = pcVar26;
      if (((((*ppuVar18)[cVar1] >> 0xb & 1) != 0) || (cVar1 == '-')) || (cVar1 == '+')) {
        if ((char)local_50 != '\0') {
          uVar19 = strtoull(pcVar26,&local_60,10);
LAB_001156f3:
          (plVar17->value).uval.min = uVar19;
          goto LAB_00115762;
        }
        if ((char)local_48 != '\0') {
          uVar19 = strtoll(pcVar26,&local_60,10);
          goto LAB_001156f3;
        }
        iVar14 = parse_range_dec64(&local_60,(uint8_t)local_64,(int64_t *)&plVar17->value);
        if (iVar14 == 0) goto LAB_00115762;
LAB_00115aaf:
        ly_vlog(ctx,LYE_INARG,LY_VLOG_NONE,(void *)0x0,local_60,"range");
        plVar31 = local_78;
        goto joined_r0x00115ad5;
      }
      iVar14 = strncmp(pcVar26,"min",3);
      puVar20 = puVar30;
      if ((iVar14 != 0) &&
         (iVar14 = strncmp(pcVar26,"max",3), puVar20 = puVar23, plVar31 = local_78, iVar14 != 0))
      goto joined_r0x00115ad5;
      (plVar17->value).sval.min = (int64_t)puVar20;
      local_60 = pcVar26 + 3;
LAB_00115762:
      puVar3 = *ppuVar18;
      pcVar21 = local_60 + 1;
      do {
        pcVar26 = pcVar21;
        cVar1 = pcVar26[-1];
        pcVar21 = pcVar26 + 1;
      } while ((*(byte *)((long)puVar3 + (long)cVar1 * 2 + 1) & 0x20) != 0);
      local_60 = pcVar26 + -1;
      if ((cVar1 == '|') || (cVar1 == '\0')) {
        puVar20 = (uint *)(plVar17->value).uval.min;
LAB_00115798:
        (plVar17->value).uval.max = (uint64_t)puVar20;
      }
      else {
        iVar14 = strncmp(local_60,"..",2);
        plVar31 = local_78;
        if (iVar14 != 0) goto joined_r0x00115ad5;
        do {
          local_60 = pcVar21;
          cVar1 = *local_60;
          uVar2 = puVar3[cVar1];
          pcVar21 = local_60 + 1;
        } while ((uVar2 >> 0xd & 1) != 0);
        if ((((uVar2 >> 0xb & 1) == 0) && (cVar1 != '-')) && (cVar1 != '+')) {
          iVar14 = strncmp(local_60,"max",3);
          plVar31 = local_78;
          if (iVar14 == 0) {
            puVar20 = local_58;
            if (((char)local_50 == '\0') && (puVar20 = puVar28, (char)local_48 != '\0')) {
              puVar20 = puVar15;
            }
            goto LAB_00115798;
          }
          goto joined_r0x00115ad5;
        }
        if ((char)local_50 != '\0') {
          puVar20 = (uint *)strtoull(local_60,&local_60,10);
          goto LAB_00115798;
        }
        if ((char)local_48 != '\0') {
          puVar20 = (uint *)strtoll(local_60,&local_60,10);
          goto LAB_00115798;
        }
        iVar14 = parse_range_dec64(&local_60,(uint8_t)local_64,&(plVar17->value).sval.max);
        if (iVar14 != 0) goto LAB_00115aaf;
      }
      puVar20 = (uint *)(plVar17->value).uval.min;
      puVar4 = (uint *)(plVar17->value).sval.max;
      plVar31 = local_78;
      if ((char)local_50 == '\0') {
        puVar11 = puVar28;
        puVar12 = puVar29;
        if ((char)local_48 != '\0') {
          puVar11 = puVar15;
          puVar12 = local_40;
        }
        if ((((long)puVar4 < (long)puVar20) || ((long)puVar20 < (long)puVar12)) ||
           (((long)puVar11 < (long)puVar4 ||
            ((local_70 != (len_ran_intv *)0x0 && ((long)puVar20 <= (local_70->value).sval.max))))))
        goto joined_r0x00115ad5;
      }
      else if (((puVar4 < puVar20) || ((puVar20 < puVar24 || (local_58 < puVar4)))) ||
              ((local_70 != (len_ran_intv *)0x0 && (puVar20 <= (uint *)(local_70->value).uval.max)))
              ) goto joined_r0x00115ad5;
      pcVar21 = strchr(str_restr,0x7c);
      plVar9 = local_78;
      str_restr = pcVar21 + 1;
      plVar31 = plVar17;
    } while (pcVar21 != (char *)0x0);
    plVar27 = plVar22;
    plVar17 = local_78;
    plVar31 = local_70;
    if (local_78 != (len_ran_intv *)0x0) {
joined_r0x00115995:
      bVar10 = plVar27 != (len_ran_intv *)0x0;
      local_70 = plVar27;
      if (bVar10) {
        do {
          plVar31 = local_78;
          if ((char)local_50 == '\0') {
            if ((char)local_48 == '\0') {
              num1 = (plVar27->value).sval.min;
              num1_00 = (plVar27->value).sval.max;
              iVar14 = dec64cmp(num1,(uint8_t)local_64,(plVar17->value).sval.min,(uint8_t)local_64);
              plVar27 = local_70;
              if ((-1 < iVar14) &&
                 (iVar14 = dec64cmp(num1,(uint8_t)local_64,(plVar17->value).sval.max,
                                    (uint8_t)local_64), plVar27 = local_70, iVar14 < 1)) {
                iVar14 = dec64cmp(num1_00,(uint8_t)local_64,(plVar17->value).sval.max,
                                  (uint8_t)local_64);
                plVar27 = local_70;
                plVar31 = local_78;
                if (0 < iVar14) goto joined_r0x00115ad5;
                goto LAB_00115a60;
              }
            }
            else {
              lVar7 = (plVar27->value).sval.min;
              if (((plVar17->value).sval.min <= lVar7) &&
                 (lVar8 = (plVar17->value).sval.max, lVar7 <= lVar8)) {
                if ((plVar27->value).sval.max <= lVar8) goto LAB_00115a60;
                goto joined_r0x00115ad5;
              }
            }
          }
          else {
            uVar5 = (plVar27->value).uval.min;
            if (((plVar17->value).uval.min <= uVar5) &&
               (uVar6 = (plVar17->value).uval.max, uVar5 <= uVar6)) goto LAB_00115a33;
          }
          plVar17 = plVar17->next;
          plVar31 = local_70;
          if (!bVar10 || plVar17 == (len_ran_intv *)0x0) break;
        } while( true );
      }
      local_70 = plVar31;
      plVar31 = local_78;
      if (!bVar10) {
        if (plVar9 != (len_ran_intv *)0x0) {
          do {
            plVar31 = plVar9;
            plVar9 = plVar31->next;
          } while (plVar9 != (len_ran_intv *)0x0);
          plVar31->next = plVar22;
          plVar22 = local_78;
        }
        goto LAB_00115a9c;
      }
joined_r0x00115ad5:
      while (plVar31 != (len_ran_intv *)0x0) {
        plVar17 = plVar31->next;
        free(plVar31);
        plVar31 = plVar17;
      }
      local_78 = (len_ran_intv *)0x0;
      while (plVar22 != (len_ran_intv *)0x0) {
        plVar31 = plVar22->next;
        free(plVar22);
        plVar22 = plVar31;
      }
      return -1;
    }
  }
LAB_00115a9c:
  *ret = plVar22;
  iVar14 = 0;
switchD_0011524f_caseD_2:
  return iVar14;
LAB_00115a33:
  if (uVar6 < (plVar27->value).uval.max) goto joined_r0x00115ad5;
LAB_00115a60:
  plVar27 = plVar27->next;
  plVar31 = local_70;
  goto joined_r0x00115995;
}

Assistant:

int
resolve_len_ran_interval(struct ly_ctx *ctx, const char *str_restr, struct lys_type *type, struct len_ran_intv **ret)
{
    /* 0 - unsigned, 1 - signed, 2 - floating point */
    int kind;
    int64_t local_smin = 0, local_smax = 0, local_fmin, local_fmax;
    uint64_t local_umin, local_umax = 0;
    uint8_t local_fdig = 0;
    const char *seg_ptr, *ptr;
    struct len_ran_intv *local_intv = NULL, *tmp_local_intv = NULL, *tmp_intv, *intv = NULL;

    switch (type->base) {
    case LY_TYPE_BINARY:
        kind = 0;
        local_umin = 0;
        local_umax = 18446744073709551615UL;

        if (!str_restr && type->info.binary.length) {
            str_restr = type->info.binary.length->expr;
        }
        break;
    case LY_TYPE_DEC64:
        kind = 2;
        local_fmin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_fmax = __INT64_C(9223372036854775807);
        local_fdig = type->info.dec64.dig;

        if (!str_restr && type->info.dec64.range) {
            str_restr = type->info.dec64.range->expr;
        }
        break;
    case LY_TYPE_INT8:
        kind = 1;
        local_smin = __INT64_C(-128);
        local_smax = __INT64_C(127);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT16:
        kind = 1;
        local_smin = __INT64_C(-32768);
        local_smax = __INT64_C(32767);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT32:
        kind = 1;
        local_smin = __INT64_C(-2147483648);
        local_smax = __INT64_C(2147483647);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT64:
        kind = 1;
        local_smin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_smax = __INT64_C(9223372036854775807);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT8:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(255);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT16:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(65535);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT32:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(4294967295);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT64:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_STRING:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.str.length) {
            str_restr = type->info.str.length->expr;
        }
        break;
    default:
        return -1;
    }

    /* process superior types */
    if (type->der) {
        if (resolve_len_ran_interval(ctx, NULL, &type->der->type, &intv)) {
            return -1;
        }
        assert(!intv || (intv->kind == kind));
    }

    if (!str_restr) {
        /* we do not have any restriction, return superior ones */
        *ret = intv;
        return EXIT_SUCCESS;
    }

    /* adjust local min and max */
    if (intv) {
        tmp_intv = intv;

        if (kind == 0) {
            local_umin = tmp_intv->value.uval.min;
        } else if (kind == 1) {
            local_smin = tmp_intv->value.sval.min;
        } else if (kind == 2) {
            local_fmin = tmp_intv->value.fval.min;
        }

        while (tmp_intv->next) {
            tmp_intv = tmp_intv->next;
        }

        if (kind == 0) {
            local_umax = tmp_intv->value.uval.max;
        } else if (kind == 1) {
            local_smax = tmp_intv->value.sval.max;
        } else if (kind == 2) {
            local_fmax = tmp_intv->value.fval.max;
        }
    }

    /* finally parse our restriction */
    seg_ptr = str_restr;
    tmp_intv = NULL;
    while (1) {
        if (!tmp_local_intv) {
            assert(!local_intv);
            local_intv = malloc(sizeof *local_intv);
            tmp_local_intv = local_intv;
        } else {
            tmp_local_intv->next = malloc(sizeof *tmp_local_intv);
            tmp_local_intv = tmp_local_intv->next;
        }
        LY_CHECK_ERR_GOTO(!tmp_local_intv, LOGMEM(ctx), error);

        tmp_local_intv->kind = kind;
        tmp_local_intv->type = type;
        tmp_local_intv->next = NULL;

        /* min */
        ptr = seg_ptr;
        while (isspace(ptr[0])) {
            ++ptr;
        }
        if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = strtoull(ptr, (char **)&ptr, 10);
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = strtoll(ptr, (char **)&ptr, 10);
            } else if (kind == 2) {
                if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.min)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                    goto error;
                }
            }
        } else if (!strncmp(ptr, "min", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umin;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smin;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmin;
            }

            ptr += 3;
        } else if (!strncmp(ptr, "max", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umax;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smax;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmax;
            }

            ptr += 3;
        } else {
            goto error;
        }

        while (isspace(ptr[0])) {
            ptr++;
        }

        /* no interval or interval */
        if ((ptr[0] == '|') || !ptr[0]) {
            if (kind == 0) {
                tmp_local_intv->value.uval.max = tmp_local_intv->value.uval.min;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.max = tmp_local_intv->value.sval.min;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.max = tmp_local_intv->value.fval.min;
            }
        } else if (!strncmp(ptr, "..", 2)) {
            /* skip ".." */
            ptr += 2;
            while (isspace(ptr[0])) {
                ++ptr;
            }

            /* max */
            if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = strtoull(ptr, (char **)&ptr, 10);
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = strtoll(ptr, (char **)&ptr, 10);
                } else if (kind == 2) {
                    if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.max)) {
                        LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                        goto error;
                    }
                }
            } else if (!strncmp(ptr, "max", 3)) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = local_umax;
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = local_smax;
                } else if (kind == 2) {
                    tmp_local_intv->value.fval.max = local_fmax;
                }
            } else {
                goto error;
            }
        } else {
            goto error;
        }

        /* check min and max in correct order */
        if (kind == 0) {
            /* current segment */
            if (tmp_local_intv->value.uval.min > tmp_local_intv->value.uval.max) {
                goto error;
            }
            if (tmp_local_intv->value.uval.min < local_umin || tmp_local_intv->value.uval.max > local_umax) {
                goto error;
            }
            /* segments sholud be ascending order */
            if (tmp_intv && (tmp_intv->value.uval.max >= tmp_local_intv->value.uval.min)) {
                goto error;
            }
        } else if (kind == 1) {
            if (tmp_local_intv->value.sval.min > tmp_local_intv->value.sval.max) {
                goto error;
            }
            if (tmp_local_intv->value.sval.min < local_smin || tmp_local_intv->value.sval.max > local_smax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.sval.max >= tmp_local_intv->value.sval.min)) {
                goto error;
            }
        } else if (kind == 2) {
            if (tmp_local_intv->value.fval.min > tmp_local_intv->value.fval.max) {
                goto error;
            }
            if (tmp_local_intv->value.fval.min < local_fmin || tmp_local_intv->value.fval.max > local_fmax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.fval.max >= tmp_local_intv->value.fval.min)) {
                /* fraction-digits value is always the same (it cannot be changed in derived types) */
                goto error;
            }
        }

        /* next segment (next OR) */
        seg_ptr = strchr(seg_ptr, '|');
        if (!seg_ptr) {
            break;
        }
        seg_ptr++;
        tmp_intv = tmp_local_intv;
    }

    /* check local restrictions against superior ones */
    if (intv) {
        tmp_intv = intv;
        tmp_local_intv = local_intv;

        while (tmp_local_intv && tmp_intv) {
            /* reuse local variables */
            if (kind == 0) {
                local_umin = tmp_local_intv->value.uval.min;
                local_umax = tmp_local_intv->value.uval.max;

                /* it must be in this interval */
                if ((local_umin >= tmp_intv->value.uval.min) && (local_umin <= tmp_intv->value.uval.max)) {
                    /* this interval is covered, next one */
                    if (local_umax <= tmp_intv->value.uval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    /* ascending order of restrictions -> fail */
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 1) {
                local_smin = tmp_local_intv->value.sval.min;
                local_smax = tmp_local_intv->value.sval.max;

                if ((local_smin >= tmp_intv->value.sval.min) && (local_smin <= tmp_intv->value.sval.max)) {
                    if (local_smax <= tmp_intv->value.sval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 2) {
                local_fmin = tmp_local_intv->value.fval.min;
                local_fmax = tmp_local_intv->value.fval.max;

                 if ((dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.min, local_fdig) > -1)
                        && (dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1)) {
                    if (dec64cmp(local_fmax, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            }

            tmp_intv = tmp_intv->next;
        }

        /* some interval left uncovered -> fail */
        if (tmp_local_intv) {
            goto error;
        }
    }

    /* append the local intervals to all the intervals of the superior types, return it all */
    if (intv) {
        for (tmp_intv = intv; tmp_intv->next; tmp_intv = tmp_intv->next);
        tmp_intv->next = local_intv;
    } else {
        intv = local_intv;
    }
    *ret = intv;

    return EXIT_SUCCESS;

error:
    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }
    while (local_intv) {
        tmp_local_intv = local_intv->next;
        free(local_intv);
        local_intv = tmp_local_intv;
    }

    return -1;
}